

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

void png_handle_tRNS(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  png_byte pVar1;
  uint uVar2;
  int iVar3;
  char *error_message;
  png_byte readbuf [256];
  ushort local_128;
  ushort local_126;
  ushort local_124;
  
  uVar2 = png_ptr->mode;
  if ((uVar2 & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((uVar2 & 4) == 0) {
    if ((info_ptr != (png_inforp)0x0) && ((info_ptr->valid & 0x10) != 0)) {
      png_crc_finish(png_ptr,length);
      error_message = "duplicate";
      goto LAB_00123417;
    }
    pVar1 = png_ptr->color_type;
    if (pVar1 != '\x03') {
      if (pVar1 == '\x02') {
        if (length != 6) {
          png_crc_finish(png_ptr,length);
          png_chunk_benign_error(png_ptr,"invalid");
          return;
        }
        png_crc_read(png_ptr,(png_bytep)&local_128,6);
        png_ptr->num_trans = 1;
        (png_ptr->trans_color).red = local_128 << 8 | local_128 >> 8;
        (png_ptr->trans_color).green = local_126 << 8 | local_126 >> 8;
        (png_ptr->trans_color).blue = local_124 << 8 | local_124 >> 8;
      }
      else {
        if (pVar1 != '\0') {
          png_crc_finish(png_ptr,length);
          error_message = "invalid with alpha channel";
          goto LAB_00123417;
        }
        if (length != 2) {
          png_crc_finish(png_ptr,length);
          png_chunk_benign_error(png_ptr,"invalid");
          return;
        }
        png_crc_read(png_ptr,(png_bytep)&local_128,2);
        png_ptr->num_trans = 1;
        (png_ptr->trans_color).gray = local_128 << 8 | local_128 >> 8;
      }
LAB_001234ba:
      iVar3 = png_crc_finish(png_ptr,0);
      if (iVar3 == 0) {
        png_set_tRNS(png_ptr,info_ptr,(png_const_bytep)&local_128,(uint)png_ptr->num_trans,
                     &png_ptr->trans_color);
      }
      else {
        png_ptr->num_trans = 0;
      }
      return;
    }
    if ((uVar2 & 2) != 0) {
      if ((0x100 < length) || ((uint)png_ptr->num_palette <= length - 1)) {
        png_crc_finish(png_ptr,length);
        error_message = "invalid";
        goto LAB_00123417;
      }
      png_crc_read(png_ptr,(png_bytep)&local_128,length);
      png_ptr->num_trans = (png_uint_16)length;
      goto LAB_001234ba;
    }
  }
  png_crc_finish(png_ptr,length);
  error_message = "out of place";
LAB_00123417:
  png_chunk_benign_error(png_ptr,error_message);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_tRNS(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte readbuf[PNG_MAX_PALETTE_LENGTH];

   png_debug(1, "in png_handle_tRNS");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   else if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_tRNS) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   if (png_ptr->color_type == PNG_COLOR_TYPE_GRAY)
   {
      png_byte buf[2];

      if (length != 2)
      {
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "invalid");
         return;
      }

      png_crc_read(png_ptr, buf, 2);
      png_ptr->num_trans = 1;
      png_ptr->trans_color.gray = png_get_uint_16(buf);
   }

   else if (png_ptr->color_type == PNG_COLOR_TYPE_RGB)
   {
      png_byte buf[6];

      if (length != 6)
      {
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "invalid");
         return;
      }

      png_crc_read(png_ptr, buf, length);
      png_ptr->num_trans = 1;
      png_ptr->trans_color.red = png_get_uint_16(buf);
      png_ptr->trans_color.green = png_get_uint_16(buf + 2);
      png_ptr->trans_color.blue = png_get_uint_16(buf + 4);
   }

   else if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
   {
      if ((png_ptr->mode & PNG_HAVE_PLTE) == 0)
      {
         /* TODO: is this actually an error in the ISO spec? */
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "out of place");
         return;
      }

      if (length > (unsigned int) png_ptr->num_palette ||
         length > (unsigned int) PNG_MAX_PALETTE_LENGTH ||
         length == 0)
      {
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "invalid");
         return;
      }

      png_crc_read(png_ptr, readbuf, length);
      png_ptr->num_trans = (png_uint_16)length;
   }

   else
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid with alpha channel");
      return;
   }

   if (png_crc_finish(png_ptr, 0) != 0)
   {
      png_ptr->num_trans = 0;
      return;
   }

   /* TODO: this is a horrible side effect in the palette case because the
    * png_struct ends up with a pointer to the tRNS buffer owned by the
    * png_info.  Fix this.
    */
   png_set_tRNS(png_ptr, info_ptr, readbuf, png_ptr->num_trans,
       &(png_ptr->trans_color));
}